

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanical.cpp
# Opt level: O0

Vector3d * __thiscall Mechanization::CalculateVfkb(Mechanization *this,Output now)

{
  Matrix<double,_3,_1,_0,_3,_1> *in_RSI;
  Vector3d *in_RDI;
  Vector3d ScullingCompensation;
  Vector3d RotationCompensation;
  Vector3d deltaThetaPrv;
  Vector3d deltaVkPrv;
  Vector3d deltaThetak;
  Vector3d deltaVk;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *other;
  Scalar *in_stack_fffffffffffffe48;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe50;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffe58;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffffe60;
  StorageBaseType *in_stack_fffffffffffffe70;
  double *in_stack_fffffffffffffe78;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffec0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffec8;
  
  other = (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)&stack0x00000008;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffe60,(Scalar *)in_stack_fffffffffffffe58,
             (Scalar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffe60,(Scalar *)in_stack_fffffffffffffe58,
             (Scalar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffe60,(Scalar *)in_stack_fffffffffffffe58,
             (Scalar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffe60,(Scalar *)in_stack_fffffffffffffe58,
             (Scalar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  Eigen::operator*(in_stack_fffffffffffffe78,(StorageBaseType *)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (in_RSI,other);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50);
  Eigen::operator*(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (in_RSI,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                     *)other);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (in_RSI,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)other);
  return in_RDI;
}

Assistant:

Vector3d Mechanization::CalculateVfkb(Output now) {
    Vector3d deltaVk(now.ax, now.ay, now.az);
    Vector3d deltaThetak(now.gx, now.gy, now.gz);

    Vector3d deltaVkPrv(prvOut.ax, prvOut.ay, prvOut.az);
    Vector3d deltaThetaPrv(prvOut.gx, prvOut.gy, prvOut.gz);

    Vector3d RotationCompensation = 0.5 * deltaThetak.cross(deltaVk);
    Vector3d ScullingCompensation = 1.0 / 12.0 * (deltaThetaPrv.cross(deltaVk) + deltaVkPrv.cross(deltaThetak));

    return (deltaVk + RotationCompensation + ScullingCompensation);
}